

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 SyStrIsNumeric(char *zSrc,sxu32 nLen,sxu8 *pReal,char **pzTail)

{
  byte bVar1;
  byte *pbVar2;
  sxi32 sVar3;
  byte *pbVar4;
  ushort **ppuVar5;
  byte *pbVar6;
  bool bVar7;
  int c;
  char *zEnd;
  char *zCur;
  char **pzTail_local;
  sxu8 *pReal_local;
  byte *pbStack_10;
  sxu32 nLen_local;
  char *zSrc_local;
  
  pbVar4 = (byte *)(zSrc + nLen);
  pbStack_10 = (byte *)zSrc;
  while( true ) {
    bVar7 = false;
    if ((pbStack_10 < pbVar4) && (bVar7 = false, *pbStack_10 < 0xc0)) {
      ppuVar5 = __ctype_b_loc();
      bVar7 = ((*ppuVar5)[(int)(char)*pbStack_10] & 0x2000) != 0;
    }
    if (!bVar7) break;
    pbStack_10 = pbStack_10 + 1;
  }
  if ((pbStack_10 < pbVar4) && ((*pbStack_10 == 0x2b || (*pbStack_10 == 0x2d)))) {
    pbStack_10 = pbStack_10 + 1;
  }
  pbVar2 = pbStack_10;
  if (pReal != (sxu8 *)0x0) {
    *pReal = '\0';
  }
  while (((((((pbVar6 = pbStack_10, pbStack_10 < pbVar4 && (*pbStack_10 < 0xc0)) &&
             (ppuVar5 = __ctype_b_loc(), ((*ppuVar5)[(int)(char)*pbStack_10] & 0x800) != 0)) &&
            ((pbVar6 = pbStack_10 + 1, pbVar6 < pbVar4 && (*pbVar6 < 0xc0)))) &&
           ((ppuVar5 = __ctype_b_loc(), ((*ppuVar5)[(int)(char)*pbVar6] & 0x800) != 0 &&
            ((pbVar6 = pbStack_10 + 2, pbVar6 < pbVar4 && (*pbVar6 < 0xc0)))))) &&
          (ppuVar5 = __ctype_b_loc(), ((*ppuVar5)[(int)(char)*pbVar6] & 0x800) != 0)) &&
         (((pbVar6 = pbStack_10 + 3, pbVar6 < pbVar4 && (*pbVar6 < 0xc0)) &&
          (ppuVar5 = __ctype_b_loc(), ((*ppuVar5)[(int)(char)*pbVar6] & 0x800) != 0))))) {
    pbStack_10 = pbStack_10 + 4;
  }
  pbStack_10 = pbVar6;
  pbVar6 = pbStack_10;
  if ((pbStack_10 < pbVar4) && (pbVar2 < pbStack_10)) {
    bVar1 = *pbStack_10;
    if (bVar1 == 0x2e) {
      pbStack_10 = pbStack_10 + 1;
      if (pReal != (sxu8 *)0x0) {
        *pReal = '\x01';
      }
      pbVar6 = pbStack_10;
      if (pzTail != (char **)0x0) {
        while( true ) {
          bVar7 = false;
          if ((pbStack_10 < pbVar4) && (bVar7 = false, *pbStack_10 < 0xc0)) {
            ppuVar5 = __ctype_b_loc();
            bVar7 = ((*ppuVar5)[(int)(char)*pbStack_10] & 0x800) != 0;
          }
          if (!bVar7) break;
          pbStack_10 = pbStack_10 + 1;
        }
        pbVar6 = pbStack_10;
        if ((pbStack_10 < pbVar4) && ((*pbStack_10 == 0x65 || (*pbStack_10 == 0x45)))) {
          pbVar6 = pbStack_10 + 1;
          if ((pbVar6 < pbVar4) && ((*pbVar6 == 0x2b || (*pbVar6 == 0x2d)))) {
            pbVar6 = pbStack_10 + 2;
          }
          while( true ) {
            pbStack_10 = pbVar6;
            bVar7 = false;
            if ((pbStack_10 < pbVar4) && (bVar7 = false, *pbStack_10 < 0xc0)) {
              ppuVar5 = __ctype_b_loc();
              bVar7 = ((*ppuVar5)[(int)(char)*pbStack_10] & 0x800) != 0;
            }
            pbVar6 = pbStack_10;
            if (!bVar7) break;
            pbVar6 = pbStack_10 + 1;
          }
        }
      }
    }
    else if ((bVar1 == 0x65) || (bVar1 == 0x45)) {
      pbVar6 = pbStack_10 + 1;
      if (pReal != (sxu8 *)0x0) {
        *pReal = '\x01';
      }
      if (pzTail != (char **)0x0) {
        if ((pbVar6 < pbVar4) && ((*pbVar6 == 0x2b || (*pbVar6 == 0x2d)))) {
          pbVar6 = pbStack_10 + 2;
        }
        while( true ) {
          pbStack_10 = pbVar6;
          bVar7 = false;
          if ((pbStack_10 < pbVar4) && (bVar7 = false, *pbStack_10 < 0xc0)) {
            ppuVar5 = __ctype_b_loc();
            bVar7 = ((*ppuVar5)[(int)(char)*pbStack_10] & 0x800) != 0;
          }
          pbVar6 = pbStack_10;
          if (!bVar7) break;
          pbVar6 = pbStack_10 + 1;
        }
      }
    }
  }
  pbStack_10 = pbVar6;
  if (pzTail != (char **)0x0) {
    *pzTail = (char *)pbStack_10;
  }
  sVar3 = -9;
  if (pbVar2 < pbStack_10) {
    sVar3 = 0;
  }
  return sVar3;
}

Assistant:

JX9_PRIVATE sxi32 SyStrIsNumeric(const char *zSrc, sxu32 nLen, sxu8 *pReal, const char  **pzTail)
{
	const char *zCur, *zEnd;
#ifdef UNTRUST
	if( SX_EMPTY_STR(zSrc) ){
		return SXERR_EMPTY;
	}
#endif
	zEnd = &zSrc[nLen];
	/* Jump leading white spaces */
	while( zSrc < zEnd && (unsigned char)zSrc[0] < 0xc0  && SyisSpace(zSrc[0]) ){
		zSrc++;
	}
	if( zSrc < zEnd && (zSrc[0] == '+' || zSrc[0] == '-') ){
		zSrc++;
	}
	zCur = zSrc;
	if( pReal ){
		*pReal = FALSE;
	}
	for(;;){
		if( zSrc >= zEnd || (unsigned char)zSrc[0] >= 0xc0 || !SyisDigit(zSrc[0]) ){ break; } zSrc++;
		if( zSrc >= zEnd || (unsigned char)zSrc[0] >= 0xc0 || !SyisDigit(zSrc[0]) ){ break; } zSrc++;
		if( zSrc >= zEnd || (unsigned char)zSrc[0] >= 0xc0 || !SyisDigit(zSrc[0]) ){ break; } zSrc++;
		if( zSrc >= zEnd || (unsigned char)zSrc[0] >= 0xc0 || !SyisDigit(zSrc[0]) ){ break; } zSrc++;
	};
	if( zSrc < zEnd && zSrc > zCur ){
		int c = zSrc[0];
		if( c == '.' ){
			zSrc++;
			if( pReal ){
				*pReal = TRUE;
			}
			if( pzTail ){
				while( zSrc < zEnd && (unsigned char)zSrc[0] < 0xc0 && SyisDigit(zSrc[0]) ){
					zSrc++;
				}
				if( zSrc < zEnd && (zSrc[0] == 'e' || zSrc[0] == 'E') ){
					zSrc++;
					if( zSrc < zEnd && (zSrc[0] == '+' || zSrc[0] == '-') ){
						zSrc++;
					}
					while( zSrc < zEnd && (unsigned char)zSrc[0] < 0xc0 && SyisDigit(zSrc[0]) ){
						zSrc++;
					}
				}
			}
		}else if( c == 'e' || c == 'E' ){
			zSrc++;
			if( pReal ){
				*pReal = TRUE;
			}
			if( pzTail ){
				if( zSrc < zEnd && (zSrc[0] == '+' || zSrc[0] == '-') ){
					zSrc++;
				}
				while( zSrc < zEnd && (unsigned char)zSrc[0] < 0xc0 && SyisDigit(zSrc[0]) ){
					zSrc++;
				}
			}
		}
	}
	if( pzTail ){
		/* Point to the non numeric part */
		*pzTail = zSrc;
	}
	return zSrc > zCur ? SXRET_OK /* String prefix is numeric */ : SXERR_INVALID /* Not a digit stream */;
}